

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O0

void __thiscall
TPZMatrixSolver<float>::UpdateFrom
          (TPZMatrixSolver<float> *this,TPZAutoPointer<TPZBaseMatrix> *mat_base)

{
  bool bVar1;
  bool bVar2;
  long in_RDI;
  TPZAutoPointer<TPZMatrix<float>_> matrix;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_ffffffffffffff98;
  TPZMatrix<float> *in_stack_ffffffffffffffa0;
  undefined1 local_38 [32];
  TPZAutoPointer<TPZBaseMatrix> *in_stack_ffffffffffffffe8;
  
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZAutoPointerDynamicCast<TPZMatrix<float>,TPZBaseMatrix>(in_stack_ffffffffffffffe8);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_ffffffffffffffa0);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 8));
  bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&stack0xffffffffffffffe8);
  if (((bVar1 == bVar2) &&
      (bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&stack0xffffffffffffffe8),
      bVar1)) &&
     (bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0xa0)), bVar1)) {
    in_stack_ffffffffffffffa0 =
         TPZAutoPointer<TPZMatrix<float>_>::operator->
                   ((TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 0xa0));
    TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffffa0,
               (TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffff98);
    (*(in_stack_ffffffffffffffa0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x35])
              (in_stack_ffffffffffffffa0,local_38);
    TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffffa0);
  }
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

virtual void UpdateFrom(TPZAutoPointer<TPZBaseMatrix> mat_base)
	{
        auto matrix =
            TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(mat_base);
		if (fReferenceMatrix == matrix && matrix)
		{
			if(this->fContainer) this->fContainer->UpdateFrom(matrix);
		}
	}